

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

void modinit(lua_State *L,char *modname)

{
  char *in_RSI;
  size_t in_RDI;
  char *dot;
  char *in_stack_00000020;
  int in_stack_0000002c;
  lua_State *in_stack_00000030;
  
  lua_pushvalue((lua_State *)dot,(int)(in_RDI >> 0x20));
  lua_setfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  lua_pushstring((lua_State *)modname,dot);
  lua_setfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  strrchr(in_RSI,0x2e);
  lua_pushlstring((lua_State *)modname,dot,in_RDI);
  lua_setfield(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  return;
}

Assistant:

static void modinit(lua_State *L, const char *modname)
{
  const char *dot;
  lua_pushvalue(L, -1);
  lua_setfield(L, -2, "_M");  /* module._M = module */
  lua_pushstring(L, modname);
  lua_setfield(L, -2, "_NAME");
  dot = strrchr(modname, '.');  /* look for last dot in module name */
  if (dot == NULL) dot = modname; else dot++;
  /* set _PACKAGE as package name (full module name minus last part) */
  lua_pushlstring(L, modname, (size_t)(dot - modname));
  lua_setfield(L, -2, "_PACKAGE");
}